

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

uint32 __thiscall
Js::PathTypeHandlerBase::ExtractSlotInfo_TTD
          (PathTypeHandlerBase *this,SnapHandlerPropertyEntry *entryInfo,
          ThreadContext *threadContext,SlabAllocator *alloc)

{
  ushort uVar1;
  PropertyId propId;
  ushort uVar2;
  SnapEntryDataKindTag dataKind;
  PropertyIndex PVar3;
  int iVar4;
  undefined4 extraout_var;
  PropertyRecord *pPVar6;
  ulong uVar7;
  byte bVar8;
  long lVar5;
  
  uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
  uVar2 = uVar1 >> 1;
  iVar4 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  if (1 < uVar1) {
    uVar7 = 0;
    do {
      if (lVar5 == 0) {
        bVar8 = 7;
      }
      else {
        bVar8 = *(byte *)(lVar5 + uVar7);
      }
      pPVar6 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,(int)uVar7);
      propId = pPVar6->pid;
      if (bVar8 == 0xf7) {
        PVar3 = TypePath::LookupInline
                          ((this->typePath).ptr,propId,
                           (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
        bVar8 = *(byte *)(lVar5 + (ulong)PVar3);
        dataKind = Setter;
      }
      else {
        dataKind = (bVar8 & 0x10) == 0 ^ Getter;
      }
      TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo,propId,bVar8 & 0xf,dataKind);
      uVar7 = uVar7 + 1;
      entryInfo = entryInfo + 1;
    } while (uVar2 != uVar7);
  }
  return (uint32)uVar2;
}

Assistant:

uint32 PathTypeHandlerBase::ExtractSlotInfo_TTD(TTD::NSSnapType::SnapHandlerPropertyEntry* entryInfo, ThreadContext* threadContext, TTD::SlabAllocator& alloc) const
    {
        uint32 plength = this->GetPathLength();
        ObjectSlotAttributes * attributes = this->GetAttributeArray();

        for(uint32 index = 0; index < plength; ++index)
        {
            ObjectSlotAttributes attr = attributes ? attributes[index] : ObjectSlotAttr_Default;
            PropertyId propertyId = GetTypePath()->GetPropertyIdUnchecked(index)->GetPropertyId();
            TTD::NSSnapType::SnapEntryDataKindTag tag;
            if (attr == ObjectSlotAttr_Setter)
            {
                attr = attributes[GetTypePath()->LookupInline(propertyId, GetPathLength())];
                tag = TTD::NSSnapType::SnapEntryDataKindTag::Setter;
            }
            else if (attr & ObjectSlotAttr_Accessor)
            {
                tag = TTD::NSSnapType::SnapEntryDataKindTag::Getter;
            }
            else
            {
                tag = TTD::NSSnapType::SnapEntryDataKindTag::Data;
            }
            TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo + index, propertyId, ObjectSlotAttributesToPropertyAttributes(attr), tag);
        }

        return plength;
    }